

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_fragment.cc
# Opt level: O2

void brotli::EmitLiterals
               (uint8_t *input,size_t len,uint8_t *depth,uint16_t *bits,size_t *storage_ix,
               uint8_t *storage)

{
  size_t j;
  size_t sVar1;
  
  for (sVar1 = 0; len != sVar1; sVar1 = sVar1 + 1) {
    WriteBits((ulong)depth[input[sVar1]],(ulong)bits[input[sVar1]],storage_ix,storage);
  }
  return;
}

Assistant:

inline void EmitLiterals(const uint8_t* input, const size_t len,
                         const uint8_t depth[256], const uint16_t bits[256],
                         size_t* storage_ix, uint8_t* storage) {
  for (size_t j = 0; j < len; j++) {
    const uint8_t lit = input[j];
    WriteBits(depth[lit], bits[lit], storage_ix, storage);
  }
}